

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

string * __thiscall
google::protobuf::internal::ExtensionSet::MutableString_abi_cxx11_
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor)

{
  byte bVar1;
  Extension *pEVar2;
  LogMessage *pLVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar5;
  LogFinisher local_d1;
  LogMessage local_d0;
  LogMessage local_98;
  LogMessage local_60;
  
  pVar5 = Insert(this,number);
  pEVar2 = pVar5.first;
  pEVar2->descriptor = descriptor;
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar2->is_repeated != false) {
      LogMessage::LogMessage
                (&local_d0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x245);
      pLVar3 = LogMessage::operator<<
                         (&local_d0,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (OPTIONAL_FIELD): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_98,pLVar3);
      LogMessage::~LogMessage(&local_d0);
    }
    bVar1 = pEVar2->type;
    if ((byte)(bVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x3f);
      pLVar3 = LogMessage::operator<<
                         (&local_98,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=((LogFinisher *)&local_60,pLVar3);
      LogMessage::~LogMessage(&local_98);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) != 9) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x245);
      pLVar3 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_STRING): "
                         );
      LogFinisher::operator=(&local_d1,pLVar3);
      LogMessage::~LogMessage(&local_60);
    }
  }
  else {
    pEVar2->type = type;
    if ((byte)(type - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x3f);
      pLVar3 = LogMessage::operator<<
                         (&local_98,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=((LogFinisher *)&local_d0,pLVar3);
      LogMessage::~LogMessage(&local_98);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4) != 9) {
      LogMessage::LogMessage
                (&local_d0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x241);
      pLVar3 = LogMessage::operator<<
                         (&local_d0,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_STRING): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_60,pLVar3);
      LogMessage::~LogMessage(&local_d0);
    }
    pEVar2->is_repeated = false;
    pbVar4 = Arena::Create<std::__cxx11::string>(this->arena_);
    (pEVar2->field_0).string_value = pbVar4;
  }
  pEVar2->field_0xa = pEVar2->field_0xa & 0xf0;
  return (string *)(pEVar2->field_0).int64_t_value;
}

Assistant:

std::string* ExtensionSet::MutableString(int number, FieldType type,
                                         const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_STRING);
    extension->is_repeated = false;
    extension->string_value = Arena::Create<std::string>(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, STRING);
  }
  extension->is_cleared = false;
  return extension->string_value;
}